

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O2

int fy_atom_iter_getc(fy_atom_iter *iter)

{
  uint uVar1;
  ssize_t sVar2;
  uint uVar3;
  uint8_t buf;
  
  uVar3 = 0xffffffff;
  if (iter != (fy_atom_iter *)0x0) {
    uVar1 = iter->unget_c;
    if (uVar1 == 0xffffffff) {
      sVar2 = fy_atom_iter_read(iter,&buf,1);
      if (sVar2 == 1) {
        uVar3 = (uint)buf;
      }
    }
    else {
      iter->unget_c = -1;
      uVar3 = uVar1 & 0xff;
    }
  }
  return uVar3;
}

Assistant:

int fy_atom_iter_getc(struct fy_atom_iter *iter) {
    uint8_t buf;
    ssize_t nread;
    int c;

    if (!iter)
        return -1;

    /* first try the pushed ungetc */
    if (iter->unget_c != -1) {
        c = iter->unget_c;
        iter->unget_c = -1;
        return c & 0xff;
    }

    /* read first octet */
    nread = fy_atom_iter_read(iter, &buf, 1);
    if (nread != 1)
        return -1;

    return (int) buf & 0xff;
}